

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscribedsignal.cpp
# Opt level: O1

void __thiscall
hbm::streaming::SubscribedSignal::interpretValuesAsDouble
          (SubscribedSignal *this,uchar *pData,size_t count)

{
  undefined8 uVar1;
  uint uVar2;
  ulong uVar3;
  size_t sVar4;
  runtime_error *this_00;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  if (this->m_dataIsBigEndian == true) {
    switch(this->m_dataValueType) {
    case DATATYPE_U32:
      if (count != 0) {
        sVar4 = 0;
        do {
          uVar2 = *(uint *)(pData + sVar4 * 4);
          this->m_valueBuffer[sVar4] =
               (double)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                       uVar2 << 0x18);
          sVar4 = sVar4 + 1;
        } while (count != sVar4);
      }
      break;
    case DATATYPE_S32:
      if (count != 0) {
        sVar4 = 0;
        do {
          uVar2 = *(uint *)(pData + sVar4 * 4);
          this->m_valueBuffer[sVar4] =
               (double)(int)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                            uVar2 << 0x18);
          sVar4 = sVar4 + 1;
        } while (count != sVar4);
      }
      break;
    case DATATYPE_REAL32:
      if (count != 0) {
        sVar4 = 0;
        do {
          uVar2 = *(uint *)(pData + sVar4 * 4);
          this->m_valueBuffer[sVar4] =
               (double)(float)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                              uVar2 << 0x18);
          sVar4 = sVar4 + 1;
        } while (count != sVar4);
      }
      break;
    case DATATYPE_U64:
      if (count != 0) {
        sVar4 = 0;
        do {
          uVar3 = *(ulong *)(pData + sVar4 * 8);
          uVar5 = (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28
                  | uVar3 << 0x38;
          auVar6._8_4_ = (int)(uVar5 >> 0x20);
          auVar6._0_8_ = uVar5;
          auVar6._12_4_ = 0x45300000;
          this->m_valueBuffer[sVar4] =
               (auVar6._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,
                                 (uint)(byte)(uVar3 >> 0x38) |
                                 ((uint)(uVar3 >> 0x20) & 0xff0000) >> 8 |
                                 (uint)(uVar3 >> 0x18) & 0xff0000 | (uint)(uVar3 >> 8) & 0xff000000)
               - 4503599627370496.0);
          sVar4 = sVar4 + 1;
        } while (count != sVar4);
      }
      break;
    case DATATYPE_S64:
      if (count != 0) {
        sVar4 = 0;
        do {
          uVar3 = *(ulong *)(pData + sVar4 * 8);
          this->m_valueBuffer[sVar4] =
               (double)(long)(uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                              (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                              (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
                              (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38);
          sVar4 = sVar4 + 1;
        } while (count != sVar4);
      }
      break;
    case DATATYPE_REAL64:
      if (count != 0) {
        sVar4 = 0;
        do {
          uVar3 = *(ulong *)(pData + sVar4 * 8);
          this->m_valueBuffer[sVar4] =
               (double)(uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                        (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                        (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
                        (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38);
          sVar4 = sVar4 + 1;
        } while (count != sVar4);
      }
      break;
    case DATATYPE_CANRAW:
      if (count != 0) {
        sVar4 = 0;
        do {
          this->m_valueBuffer[sVar4] = (double)pData[sVar4];
          sVar4 = sVar4 + 1;
        } while (count != sVar4);
      }
      break;
    default:
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"datatype not supported!");
LAB_0011816d:
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    switch(this->m_dataValueType) {
    case DATATYPE_U32:
      if (count != 0) {
        sVar4 = 0;
        do {
          this->m_valueBuffer[sVar4] = (double)*(uint *)(pData + sVar4 * 4);
          sVar4 = sVar4 + 1;
        } while (count != sVar4);
      }
      break;
    case DATATYPE_S32:
      if (count != 0) {
        sVar4 = 0;
        do {
          this->m_valueBuffer[sVar4] = (double)*(int *)(pData + sVar4 * 4);
          sVar4 = sVar4 + 1;
        } while (count != sVar4);
      }
      break;
    case DATATYPE_REAL32:
      if (count != 0) {
        sVar4 = 0;
        do {
          this->m_valueBuffer[sVar4] = (double)*(float *)(pData + sVar4 * 4);
          sVar4 = sVar4 + 1;
        } while (count != sVar4);
      }
      break;
    case DATATYPE_U64:
      if (count != 0) {
        sVar4 = 0;
        do {
          uVar1 = *(undefined8 *)(pData + sVar4 * 8);
          auVar7._8_4_ = (int)((ulong)uVar1 >> 0x20);
          auVar7._0_8_ = uVar1;
          auVar7._12_4_ = 0x45300000;
          this->m_valueBuffer[sVar4] =
               (auVar7._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
          sVar4 = sVar4 + 1;
        } while (count != sVar4);
      }
      break;
    case DATATYPE_S64:
      if (count != 0) {
        sVar4 = 0;
        do {
          this->m_valueBuffer[sVar4] = (double)*(long *)(pData + sVar4 * 8);
          sVar4 = sVar4 + 1;
        } while (count != sVar4);
      }
      break;
    case DATATYPE_REAL64:
      if (count != 0) {
        sVar4 = 0;
        do {
          this->m_valueBuffer[sVar4] = *(double *)(pData + sVar4 * 8);
          sVar4 = sVar4 + 1;
        } while (count != sVar4);
      }
      break;
    case DATATYPE_CANRAW:
      if (count != 0) {
        sVar4 = 0;
        do {
          this->m_valueBuffer[sVar4] = (double)pData[sVar4];
          sVar4 = sVar4 + 1;
        } while (count != sVar4);
      }
      break;
    default:
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"datatype not supported!");
      goto LAB_0011816d;
    }
  }
  return;
}

Assistant:

void SubscribedSignal::interpretValuesAsDouble(unsigned char *pData, size_t count)
		{
			if(m_dataIsBigEndian) {
				switch (m_dataValueType) {
					case DATATYPE_REAL32:
						for(size_t i=0; i<count; ++i) {
							m_valueBuffer[i] = hbm::streaming::extract<float, hbm::streaming::big>()(&pData);
						}
						break;

					case DATATYPE_REAL64:
						for(size_t i=0; i<count; ++i) {
							m_valueBuffer[i] = hbm::streaming::extract<double, hbm::streaming::big>()(&pData);
						}
						break;

					case DATATYPE_U32:
						for(size_t i=0; i<count; ++i) {
							m_valueBuffer[i] = hbm::streaming::extract<uint32_t, hbm::streaming::big>()(&pData);
						}
						break;

					case DATATYPE_S32:
						for(size_t i=0; i<count; ++i) {
							m_valueBuffer[i] = hbm::streaming::extract<int32_t, hbm::streaming::big>()(&pData);
						}
						break;

					case DATATYPE_U64:
						for(size_t i=0; i<count; ++i) {
							m_valueBuffer[i] = static_cast < double > (hbm::streaming::extract<uint64_t, hbm::streaming::big>()(&pData));
						}
						break;

					case DATATYPE_S64:
						for(size_t i=0; i<count; ++i) {
							m_valueBuffer[i] = static_cast < double > (hbm::streaming::extract<int64_t, hbm::streaming::big>()(&pData));
						}
						break;
					case DATATYPE_CANRAW:
						for(size_t i=0; i<count; ++i) {
							m_valueBuffer[i] = hbm::streaming::extract<uint8_t, hbm::streaming::big>()(&pData);
						}
						break;

					default:
						throw std::runtime_error("datatype not supported!");
						break;
				}
			} else {
				switch (m_dataValueType) {
					case DATATYPE_REAL32:
						for(size_t i=0; i<count; ++i) {
							m_valueBuffer[i] = hbm::streaming::extract<float, hbm::streaming::little>()(&pData);
						}
						break;

					case DATATYPE_REAL64:
						for(size_t i=0; i<count; ++i) {
							m_valueBuffer[i] = hbm::streaming::extract<double, hbm::streaming::little>()(&pData);
						}
						break;

					case DATATYPE_U32:
						for(size_t i=0; i<count; ++i) {
							m_valueBuffer[i] = hbm::streaming::extract<uint32_t, hbm::streaming::little>()(&pData);
						}
						break;

					case DATATYPE_S32:
						for(size_t i=0; i<count; ++i) {
							m_valueBuffer[i] = hbm::streaming::extract<int32_t, hbm::streaming::little>()(&pData);
						}
						break;

					case DATATYPE_U64:
						for(size_t i=0; i<count; ++i) {
							m_valueBuffer[i] = static_cast < double > (hbm::streaming::extract<uint64_t, hbm::streaming::little>()(&pData));
						}
						break;

					case DATATYPE_S64:
						for(size_t i=0; i<count; ++i) {
							m_valueBuffer[i] = static_cast < double > (hbm::streaming::extract<int64_t, hbm::streaming::little>()(&pData));
						}
						break;
                    case DATATYPE_CANRAW:
                        for(size_t i=0; i<count; ++i) {
                            m_valueBuffer[i] = hbm::streaming::extract<uint8_t, hbm::streaming::little>()(&pData);
                        }
                        break;

					default:
						throw std::runtime_error("datatype not supported!");
						break;
				}
			}
		}